

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O1

uint32_t helper_bcdsr_ppc(ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b,uint32_t ps)

{
  char cVar1;
  uint64_t uVar2;
  _Bool _Var3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  bool bVar8;
  _Bool ox_flag;
  ppc_avr_t ret;
  int invalid;
  int unused;
  ppc_avr_t bcd_one;
  _Bool local_59;
  ppc_avr_t local_58;
  int local_40 [2];
  ppc_avr_t local_38;
  
  local_40[1] = 0;
  local_40[0] = 0;
  local_59 = false;
  bVar4 = b->u8[0];
  uVar2 = b->u64[1];
  local_58.u8[0] = (uint8_t)b->u64[0];
  local_58.u64[0]._1_7_ = (undefined7)(b->u64[0] >> 8);
  local_58.u8[8] = (uint8_t)uVar2;
  local_58.u64[1]._1_4_ = (undefined4)(uVar2 >> 8);
  local_58.u32[3]._1_2_ = (undefined2)(uVar2 >> 0x28);
  local_58.u8[0xf] = (uint8_t)(uVar2 >> 0x38);
  local_58.u8[0] = local_58.u8[0] & 0xf0;
  cVar1 = a->s8[8];
  iVar7 = (int)cVar1;
  local_38.u64[1] = 0;
  local_38.u64[0] = 0x10;
  _Var3 = bcd_is_valid(b);
  uVar6 = 1;
  if (_Var3) {
    if (cVar1 < ' ') {
      if (cVar1 < -0x1f) {
        iVar7 = -0x1f;
      }
    }
    else {
      iVar7 = 0x1f;
    }
    if (iVar7 < 1) {
      urshift(local_58.u64,local_58.u64 + 1,iVar7 * -4);
      if (9 < (local_58.u8[0] & 0xf)) {
        local_40[0] = 1;
      }
      if (4 < (local_58.u8[0] & 0xf)) {
        bcd_add_mag(&local_58,&local_58,&local_38,local_40,local_40 + 1);
      }
    }
    else {
      ulshift(local_58.u64,local_58.u64 + 1,iVar7 << 2,&local_59);
    }
    bVar8 = ((bVar4 & 0xf) - 0xb & 0xfd) == 0;
    bVar4 = 0xd;
    if (!bVar8) {
      bVar4 = (ps != 0) * '\x03' + 0xc;
    }
    bVar4 = local_58.u8[0] & 0xf0 | bVar4;
    uVar5 = (uint)bVar8 * 4 + 4;
    uVar6 = 2;
    if (0xf < CONCAT71(local_58.u64[0]._1_7_,bVar4)) {
      uVar6 = uVar5;
    }
    if (CONCAT17(local_58.u8[0xf],
                 CONCAT25(local_58.u32[3]._1_2_,CONCAT41(local_58.u64[1]._1_4_,local_58.u8[8]))) !=
        0) {
      uVar6 = uVar5;
    }
    uVar6 = local_59 | uVar6;
    r->u8[0] = bVar4;
    *(ulong *)((long)&(r->f128).low + 1) = CONCAT17(local_58.u8[8],local_58.u64[0]._1_7_);
    *(undefined4 *)(r->u8 + 9) = local_58.u64[1]._1_4_;
    *(undefined2 *)(r->u8 + 0xd) = local_58.u32[3]._1_2_;
    r->u8[0xf] = local_58.u8[0xf];
  }
  return uVar6;
}

Assistant:

uint32_t helper_bcdsr(ppc_avr_t *r, ppc_avr_t *a, ppc_avr_t *b, uint32_t ps)
{
    int cr;
    int unused = 0;
    int invalid = 0;
    bool ox_flag = false;
    int sgnb = bcd_get_sgn(b);
    ppc_avr_t ret = *b;
    ret.VsrD(1) &= ~0xf;

    int i = a->VsrSB(7);
    ppc_avr_t bcd_one;

    bcd_one.VsrD(0) = 0;
    bcd_one.VsrD(1) = 0x10;

    if (bcd_is_valid(b) == false) {
        return CRF_SO;
    }

    if (unlikely(i > 31)) {
        i = 31;
    } else if (unlikely(i < -31)) {
        i = -31;
    }

    if (i > 0) {
        ulshift(&ret.VsrD(1), &ret.VsrD(0), i * 4, &ox_flag);
    } else {
        urshift(&ret.VsrD(1), &ret.VsrD(0), -i * 4);

        if (bcd_get_digit(&ret, 0, &invalid) >= 5) {
            bcd_add_mag(&ret, &ret, &bcd_one, &invalid, &unused);
        }
    }
    bcd_put_digit(&ret, bcd_preferred_sgn(sgnb, ps), 0);

    cr = bcd_cmp_zero(&ret);
    if (ox_flag) {
        cr |= CRF_SO;
    }
    *r = ret;

    return cr;
}